

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  init_policy_type iVar1;
  context *ctx;
  context *ctx_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  rep rVar6;
  long lVar7;
  long lVar8;
  random_engine *rng;
  int iVar9;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar13;
  double dVar14;
  compute_order compute;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  slv;
  bit_array_impl local_2c8;
  longdouble local_2b4;
  bit_array_impl local_2a8;
  default_cost_type<long_double> *local_298;
  double local_290;
  int local_288;
  longdouble local_284;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  cost_type local_268;
  longdouble local_254;
  longdouble local_248;
  longdouble local_23c;
  long local_230;
  double local_228;
  double local_220;
  compute_order local_218;
  longdouble local_1e0;
  longdouble local_1d4;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  local_1c8;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_290 = cost_constant;
  bit_array_impl::bit_array_impl(&local_2c8,variables);
  ctx = this->m_ctx;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)&local_268,ctx,original_costs,this->m_rng,variables);
  local_248 = (longdouble)(ctx->parameters).kappa_step;
  local_23c = (longdouble)(ctx->parameters).kappa_max;
  local_254 = (longdouble)(ctx->parameters).alpha;
  local_2b4 = (longdouble)(ctx->parameters).theta;
  dVar14 = (ctx->parameters).delta;
  if (0.0 <= dVar14) {
    local_284 = (longdouble)dVar14;
    local_220 = dVar14;
  }
  else {
    ctx_00 = this->m_ctx;
    local_1c8._0_10_ = local_2b4;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = _DAT_00622fa0;
    if (variables != 0) {
      lVar8 = 0;
      do {
        lVar12 = *(longdouble *)
                  ((long)local_268.linear_elements._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar8);
        lVar10 = ABS(lVar12);
        lVar11 = (longdouble)
                 local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._0_10_;
        if (lVar10 <= (longdouble)
                      local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._0_10_ ||
            (longdouble)
            local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._0_10_ != lVar10) {
          lVar11 = lVar10;
        }
        if ((longdouble)0 != lVar12) {
          local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_10_ = lVar11;
        }
        if (NAN((longdouble)0) || NAN(lVar12)) {
          local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_10_ = lVar11;
        }
        lVar8 = lVar8 + 0x10;
        in_ST3 = in_ST2;
        in_ST4 = in_ST2;
        in_ST5 = in_ST2;
      } while ((ulong)(uint)variables << 4 != lVar8);
    }
    lVar12 = (longdouble)
             local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._0_10_ -
             local_2b4 *
             (longdouble)
             local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._0_10_;
    local_2a8._0_8_ = SUB108(lVar12,0);
    local_2a8.m_data._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_ =
         (undefined2)((unkuint10)lVar12 >> 0x40);
    info<long_double,long_double,long_double>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",
               (longdouble *)&local_2a8,(longdouble *)&local_218,(longdouble *)&local_1c8);
    local_284 = (longdouble)
                CONCAT28(local_2a8.m_data._M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_,
                         local_2a8._0_8_);
  }
  local_1d4 = (longdouble)(ctx->parameters).pushing_k_factor;
  local_1e0 = (longdouble)(ctx->parameters).pushing_objective_amplifier;
  local_230 = (long)(ctx->parameters).w;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  ::solver_inequalities_Zcoeff
            (&local_1c8,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_268,constraints);
  compute_order::compute_order(&local_218,(ctx->parameters).order,variables);
  dVar14 = (this->m_ctx->parameters).init_policy_random;
  local_2a8.m_size = 0;
  local_2a8.m_block_size = 0;
  local_2a8.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_ = 0;
  local_2a8.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._2_6_ = 0;
  iVar1 = (ctx->parameters).init_policy;
  local_288 = variables;
  if (iVar1 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_2c8,original_costs,variables,0);
  }
  else {
    if (iVar1 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_2c8;
      x_optimistic = &local_2a8;
    }
    else {
      if (iVar1 != optimistic_solve) goto LAB_005fad04;
      rng = this->m_rng;
      x_pessimistic = &local_2a8;
      x_optimistic = &local_2c8;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_005fad04:
  local_298 = original_costs;
  if (local_2c8.m_size != 0) {
    iVar9 = 0;
    do {
      dVar13 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar13 < dVar14) {
        bit_array_impl::invert(&local_2c8,iVar9);
      }
      iVar9 = iVar9 + 1;
    } while (local_2c8.m_size != iVar9);
  }
  if ((void *)CONCAT62(local_2a8.m_data._M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._2_6_,
                       local_2a8.m_data._M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._0_2_) !=
      (void *)0x0) {
    operator_delete__((void *)CONCAT62(local_2a8.m_data._M_t.
                                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl.
                                       _2_6_,local_2a8.m_data._M_t.
                                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl._0_2_));
  }
  dVar14 = (ctx->parameters).kappa_min;
  rVar6 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar6;
  rVar6 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar6;
  compute_order::
  init<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
            (&local_218,&local_1c8,(bit_array *)&local_2c8);
  if ((ctx->parameters).limit != 0) {
    iVar9 = 0x7fffffff;
    lVar8 = 0;
    lVar12 = (longdouble)dVar14;
    local_228 = dVar14;
    while( true ) {
      iVar3 = compute_order::
              run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                        (&local_218,&local_1c8,(bit_array *)&local_2c8,this->m_rng,lVar12,local_284,
                         local_2b4);
      if (iVar3 == 0) {
        dVar14 = default_cost_type<long_double>::results
                           (local_298,(bit_array *)&local_2c8,local_290);
        store_if_better(this,(bit_array *)&local_2c8,dVar14,lVar8);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_005faede;
        iVar9 = 0;
        iVar3 = 0;
        goto LAB_005faff1;
      }
      if (iVar3 < iVar9) {
        store_if_better(this,(bit_array *)&local_2c8,iVar3,lVar8);
        iVar9 = iVar3;
      }
      if (local_230 < lVar8) {
        local_26c = local_1c8.m;
        lVar11 = in_ST5;
        local_270 = iVar3;
        powl();
        lVar12 = lVar12 + local_248 * in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = lVar11;
      }
      if (local_23c < lVar12) break;
      lVar7 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar7;
      dVar14 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar14) && (dVar14 < (double)(lVar7 - (this->m_begin).__d.__r) / 1000000000.0)) ||
         (lVar8 = lVar8 + 1, lVar8 == (ctx->parameters).limit)) break;
    }
  }
  __return_storage_ptr__->status = limit_reached;
LAB_005faede:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,local_288);
  }
  if (local_218.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  ::~solver_inequalities_Zcoeff(&local_1c8);
  if ((__uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>)
      local_268.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>)0x0) {
    operator_delete__((void *)local_268.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_2c8.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_2c8.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
LAB_005faff1:
  do {
    lVar11 = in_ST4;
    iVar4 = compute_order::
            push_and_run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                      (&local_218,&local_1c8,(bit_array *)&local_2c8,this->m_rng,local_1d4 * lVar12,
                       local_284,local_2b4,local_1e0);
    if (iVar4 == 0) {
      dVar14 = default_cost_type<long_double>::results(local_298,(bit_array *)&local_2c8,local_290);
      store_if_better(this,(bit_array *)&local_2c8,dVar14,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar3));
    }
    lVar8 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar8;
    dVar14 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar14) && (dVar14 < (double)(lVar8 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar4 = 1;
      while (iVar5 = compute_order::
                     run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                               (&local_218,&local_1c8,(bit_array *)&local_2c8,this->m_rng,lVar12,
                                local_284,local_2b4), iVar5 != 0) {
        if ((ctx->parameters).w < (double)(iVar4 + -1)) {
          local_274 = local_1c8.m;
          lVar10 = lVar11;
          local_278 = iVar5;
          powl();
          lVar12 = lVar12 + local_248 * in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar11;
          lVar11 = lVar10;
        }
        if (local_23c < lVar12) goto LAB_005fb20f;
        lVar8 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar8;
        dVar14 = (this->m_ctx->parameters).time_limit;
        if (((0.0 < dVar14) && (dVar14 < (double)(lVar8 - (this->m_begin).__d.__r) / 1000000000.0))
           || (bVar2 = (ctx->parameters).pushing_iteration_limit <= iVar4, iVar4 = iVar4 + 1, bVar2)
           ) goto LAB_005fb20f;
      }
      dVar14 = default_cost_type<long_double>::results(local_298,(bit_array *)&local_2c8,local_290);
      store_if_better(this,(bit_array *)&local_2c8,dVar14,
                      (long)((ctx->parameters).pushing_iteration_limit * iVar9 - iVar4));
    }
LAB_005fb20f:
    iVar3 = iVar3 + 1;
    iVar9 = iVar9 + -1;
  } while (iVar3 < (ctx->parameters).pushes_limit);
  goto LAB_005faede;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }